

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O1

int AndersonAcc(KINMem kin_mem,N_Vector gval,N_Vector fv,N_Vector x,N_Vector xold,long iter,
               sunrealtype *R,sunrealtype *gamma)

{
  N_Vector p_Var1;
  N_Vector p_Var2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  int error_code;
  long lVar10;
  sunrealtype *psVar11;
  uint uVar12;
  char *pcVar13;
  long lVar14;
  ulong uVar15;
  double *pdVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  double dVar20;
  double dVar21;
  long local_48;
  sunrealtype *local_40;
  N_Vector *local_38;
  
  psVar11 = kin_mem->kin_cv;
  local_38 = kin_mem->kin_Xv;
  N_VLinearSum(0x3ff0000000000000,gval,xold);
  if (0 < iter) {
    lVar7 = kin_mem->kin_m_aa;
    if (kin_mem->kin_current_depth == lVar7) {
      p_Var1 = *kin_mem->kin_dg_aa;
      p_Var2 = *kin_mem->kin_df_aa;
      if (1 < lVar7) {
        lVar10 = 1;
        do {
          kin_mem->kin_dg_aa[lVar10 + -1] = kin_mem->kin_dg_aa[lVar10];
          kin_mem->kin_df_aa[lVar10 + -1] = kin_mem->kin_df_aa[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar7 != lVar10);
      }
      kin_mem->kin_dg_aa[lVar7 + -1] = p_Var1;
      kin_mem->kin_df_aa[lVar7 + -1] = p_Var2;
      AndersonAccQRDelete(kin_mem,kin_mem->kin_q_aa,R,(int)lVar7);
      kin_mem->kin_current_depth = kin_mem->kin_current_depth + -1;
    }
    N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,gval,kin_mem->kin_gold_aa,
                 kin_mem->kin_dg_aa[kin_mem->kin_current_depth]);
    N_VLinearSum(0x3ff0000000000000,fv,kin_mem->kin_fold_aa,
                 kin_mem->kin_df_aa[kin_mem->kin_current_depth]);
    kin_mem->kin_current_depth = kin_mem->kin_current_depth + 1;
  }
  N_VScale(0x3ff0000000000000,gval,kin_mem->kin_gold_aa);
  N_VScale(0x3ff0000000000000,fv,kin_mem->kin_fold_aa);
  lVar7 = kin_mem->kin_current_depth;
  if (lVar7 == 1) {
    dVar21 = (double)N_VDotProd(*kin_mem->kin_df_aa,*kin_mem->kin_df_aa);
    dVar20 = 0.0;
    if (0.0 < dVar21) {
      dVar20 = (double)N_VDotProd(*kin_mem->kin_df_aa,*kin_mem->kin_df_aa);
      if (dVar20 < 0.0) {
        dVar20 = sqrt(dVar20);
      }
      else {
        dVar20 = SQRT(dVar20);
      }
    }
    *R = dVar20;
    local_40 = psVar11;
    N_VScale(1.0 / dVar20,*kin_mem->kin_df_aa,*kin_mem->kin_q_aa);
  }
  else {
    if (lVar7 == 0) {
      if ((kin_mem->kin_damping_aa == 0) && (kin_mem->kin_damping_fn == (KINDampingFn)0x0)) {
        N_VScale(0x3ff0000000000000,gval,x);
        return 0;
      }
      if (kin_mem->kin_damping_fn == (KINDampingFn)0x0) {
LAB_0010ce97:
        N_VLinearSum(1.0 - kin_mem->kin_beta_aa,xold,gval,x);
        return 0;
      }
      iVar5 = (*kin_mem->kin_damping_fn)
                        (kin_mem->kin_nni,xold,gval,(sunrealtype *)0x0,0,kin_mem->kin_user_data,
                         &kin_mem->kin_beta_aa);
      if (iVar5 == 0) {
        dVar21 = kin_mem->kin_beta_aa;
        if ((0.0 < dVar21) && (dVar21 <= 1.0)) goto LAB_0010ce97;
        pcVar13 = "The damping parameter is outside of the range (0, 1].";
        iVar5 = 0xc3d;
      }
      else {
        pcVar13 = "The damping function failed.";
        iVar5 = 0xc37;
      }
      goto LAB_0010d190;
    }
    local_40 = psVar11;
    (*kin_mem->kin_qr_func)
              (kin_mem->kin_q_aa,R,kin_mem->kin_df_aa[lVar7 + -1],(int)lVar7 + -1,
               (int)kin_mem->kin_m_aa,kin_mem->kin_qr_data);
  }
  if (kin_mem->kin_depth_fn != (KINDepthFn)0x0) {
    local_48 = kin_mem->kin_current_depth;
    iVar5 = (*kin_mem->kin_depth_fn)
                      (kin_mem->kin_nni,xold,gval,fv,kin_mem->kin_df_aa,R,local_48,
                       kin_mem->kin_user_data,&local_48,(int *)0x0);
    if (iVar5 != 0) {
      pcVar13 = "The depth function failed.";
      iVar9 = -0x13;
      error_code = -0x13;
      iVar5 = 0xc6b;
      goto LAB_0010cce2;
    }
    lVar7 = kin_mem->kin_current_depth;
    lVar10 = local_48;
    if (lVar7 <= local_48) {
      lVar10 = lVar7;
    }
    local_48 = 0;
    iVar9 = 0;
    if (lVar10 < 1) {
      kin_mem->kin_current_depth = 0;
      if ((kin_mem->kin_damping_aa == 0) && (kin_mem->kin_damping_fn == (KINDampingFn)0x0)) {
        N_VScale(0x3ff0000000000000,gval,x);
      }
      else {
        if (kin_mem->kin_damping_fn != (KINDampingFn)0x0) {
          iVar5 = (*kin_mem->kin_damping_fn)
                            (kin_mem->kin_nni,xold,gval,(sunrealtype *)0x0,0,kin_mem->kin_user_data,
                             &kin_mem->kin_beta_aa);
          if (iVar5 == 0) {
            dVar21 = kin_mem->kin_beta_aa;
            if ((0.0 < dVar21) && (dVar21 <= 1.0)) goto LAB_0010d1c1;
            pcVar13 = "The damping parameter is outside of the range (0, 1].";
            iVar9 = -0x12;
            error_code = -0x12;
            iVar5 = 0xc87;
          }
          else {
            pcVar13 = "The damping function failed.";
            iVar9 = -0x12;
            error_code = -0x12;
            iVar5 = 0xc81;
          }
LAB_0010cce2:
          bVar19 = false;
          KINProcessError(kin_mem,error_code,iVar5,"AndersonAcc",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                          ,pcVar13);
          goto LAB_0010cce9;
        }
LAB_0010d1c1:
        N_VLinearSum(1.0 - kin_mem->kin_beta_aa,xold,gval,x);
      }
      iVar9 = 0;
      bVar19 = false;
    }
    else {
      bVar19 = true;
      local_48 = lVar10;
      if ((lVar10 < lVar7) && (lVar7 = kin_mem->kin_current_depth, lVar10 < lVar7)) {
        lVar10 = 0;
        do {
          p_Var1 = *kin_mem->kin_dg_aa;
          p_Var2 = *kin_mem->kin_df_aa;
          if (1 < lVar7) {
            lVar14 = 1;
            do {
              kin_mem->kin_dg_aa[lVar14 + -1] = kin_mem->kin_dg_aa[lVar14];
              kin_mem->kin_df_aa[lVar14 + -1] = kin_mem->kin_df_aa[lVar14];
              lVar14 = lVar14 + 1;
            } while (lVar7 != lVar14);
          }
          kin_mem->kin_dg_aa[lVar7 + -1] = p_Var1;
          kin_mem->kin_df_aa[lVar7 + -1] = p_Var2;
          AndersonAccQRDelete(kin_mem,kin_mem->kin_q_aa,R,(int)lVar7);
          lVar7 = kin_mem->kin_current_depth + -1;
          kin_mem->kin_current_depth = lVar7;
          lVar10 = lVar10 + 1;
        } while (lVar10 < lVar7 - local_48);
        iVar9 = 0;
      }
    }
LAB_0010cce9:
    if (!bVar19) {
      return iVar9;
    }
  }
  uVar17 = kin_mem->kin_current_depth;
  iVar5 = N_VDotProdMulti(uVar17 & 0xffffffff,fv,kin_mem->kin_q_aa,gamma);
  if (iVar5 != 0) {
    return -0x10;
  }
  if (kin_mem->kin_damping_fn != (KINDampingFn)0x0) {
    iVar5 = (*kin_mem->kin_damping_fn)
                      (kin_mem->kin_nni,xold,gval,gamma,uVar17,kin_mem->kin_user_data,
                       &kin_mem->kin_beta_aa);
    if (iVar5 == 0) {
      dVar21 = kin_mem->kin_beta_aa;
      if ((0.0 < dVar21) && (dVar21 <= 1.0)) goto LAB_0010cf93;
      pcVar13 = "The damping parameter is outside of the range (0, 1].";
      iVar5 = 0xcce;
    }
    else {
      pcVar13 = "The damping function failed.";
      iVar5 = 0xcc8;
    }
LAB_0010d190:
    KINProcessError(kin_mem,-0x12,iVar5,"AndersonAcc",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                    ,pcVar13);
    return -0x12;
  }
LAB_0010cf93:
  *local_40 = 1.0;
  *local_38 = gval;
  if ((long)uVar17 < 1) {
    uVar18 = 1;
  }
  else {
    lVar10 = kin_mem->kin_m_aa;
    lVar7 = uVar17 * 8;
    psVar11 = R + uVar17;
    lVar14 = 0;
    uVar15 = 1;
    uVar4 = uVar17;
    do {
      uVar6 = uVar4 - 1;
      psVar11 = psVar11 + -1;
      if ((long)uVar4 < (long)uVar17) {
        lVar3 = kin_mem->kin_m_aa;
        dVar21 = gamma[uVar6];
        pdVar16 = (double *)(lVar3 * lVar7 + (long)psVar11);
        lVar8 = lVar14;
        do {
          dVar21 = dVar21 - *pdVar16 * gamma[uVar17 + lVar8];
          gamma[uVar6] = dVar21;
          pdVar16 = pdVar16 + lVar3;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0);
      }
      dVar21 = gamma[uVar6];
      dVar20 = R[(lVar10 + 1) * uVar6];
      gamma[uVar6] = dVar21 / dVar20;
      local_40[uVar15] = -(dVar21 / dVar20);
      local_38[uVar15] = kin_mem->kin_dg_aa[uVar6];
      uVar18 = uVar15 + 1;
      lVar14 = lVar14 + -1;
      lVar7 = lVar7 + -8;
      bVar19 = uVar15 != uVar17;
      uVar15 = uVar18;
      uVar4 = uVar6;
    } while (bVar19);
  }
  if ((kin_mem->kin_damping_aa != 0) || (kin_mem->kin_damping_fn != (KINDampingFn)0x0)) {
    dVar21 = 1.0 - kin_mem->kin_beta_aa;
    local_40[uVar18 & 0xffffffff] = -dVar21;
    local_38[uVar18 & 0xffffffff] = fv;
    uVar12 = (int)uVar18 + 1;
    uVar18 = (ulong)uVar12;
    if (0 < (long)uVar17) {
      lVar7 = 0;
      do {
        local_40[(ulong)uVar12 + lVar7] = gamma[uVar17 - 1] * dVar21;
        local_38[(ulong)uVar12 + lVar7] = kin_mem->kin_df_aa[uVar17 - 1];
        lVar7 = lVar7 + 1;
        uVar18 = uVar17 - 1;
        bVar19 = 0 < (long)uVar17;
        uVar17 = uVar18;
      } while (uVar18 != 0 && bVar19);
      uVar18 = (ulong)(uVar12 + (int)lVar7);
    }
  }
  iVar5 = N_VLinearCombination(uVar18,local_40,local_38,x);
  return (uint)(iVar5 == 0) * 0x10 + -0x10;
}

Assistant:

static int AndersonAcc(KINMem kin_mem, N_Vector gval, N_Vector fv, N_Vector x,
                       N_Vector xold, long int iter, sunrealtype* R,
                       sunrealtype* gamma)
{
  int retval;
  long int lAA;
  sunrealtype alfa;
  sunrealtype onembeta;

  /* local shortcuts for fused vector operation */
  int nvec        = 0;
  sunrealtype* cv = kin_mem->kin_cv;
  N_Vector* Xv    = kin_mem->kin_Xv;

  /* Compute residual F(x) = G(x_old) - x_old */
  N_VLinearSum(ONE, gval, -ONE, xold, fv);

  if (iter > 0)
  {
    /* If we've filled the acceleration subspace, start recycling */
    if (kin_mem->kin_current_depth == kin_mem->kin_m_aa)
    {
      /* Move the left-most column vector (oldest value) to the end so it gets
         overwritten with the newest value below. */
      N_Vector tmp_dg = kin_mem->kin_dg_aa[0];
      N_Vector tmp_df = kin_mem->kin_df_aa[0];
      for (long int i = 1; i < kin_mem->kin_m_aa; i++)
      {
        kin_mem->kin_dg_aa[i - 1] = kin_mem->kin_dg_aa[i];
        kin_mem->kin_df_aa[i - 1] = kin_mem->kin_df_aa[i];
      }
      kin_mem->kin_dg_aa[kin_mem->kin_m_aa - 1] = tmp_dg;
      kin_mem->kin_df_aa[kin_mem->kin_m_aa - 1] = tmp_df;

      /* Delete left-most column vector from QR factorization */
      retval = AndersonAccQRDelete(kin_mem, kin_mem->kin_q_aa, R,
                                   (int)kin_mem->kin_m_aa);
      if (retval) { return retval; }

      kin_mem->kin_current_depth--;
    }

    /* compute dg_new = gval - gval_old */
    N_VLinearSum(ONE, gval, -ONE, kin_mem->kin_gold_aa,
                 kin_mem->kin_dg_aa[kin_mem->kin_current_depth]);

    /* compute df_new = fval - fval_old */
    N_VLinearSum(ONE, fv, -ONE, kin_mem->kin_fold_aa,
                 kin_mem->kin_df_aa[kin_mem->kin_current_depth]);

    kin_mem->kin_current_depth++;
  }

  N_VScale(ONE, gval, kin_mem->kin_gold_aa);
  N_VScale(ONE, fv, kin_mem->kin_fold_aa);

  /* on first iteration, do fixed point update */
  if (kin_mem->kin_current_depth == 0)
  {
    if (kin_mem->kin_damping_aa || kin_mem->kin_damping_fn)
    {
      if (kin_mem->kin_damping_fn)
      {
        retval = kin_mem->kin_damping_fn(kin_mem->kin_nni, xold, gval, NULL, 0,
                                         kin_mem->kin_user_data,
                                         &(kin_mem->kin_beta_aa));
        if (retval)
        {
          KINProcessError(kin_mem, KIN_DAMPING_FN_ERR, __LINE__, __func__,
                          __FILE__, "The damping function failed.");
          return KIN_DAMPING_FN_ERR;
        }
        if (kin_mem->kin_beta_aa <= ZERO || kin_mem->kin_beta_aa > ONE)
        {
          KINProcessError(kin_mem, KIN_DAMPING_FN_ERR, __LINE__, __func__,
                          __FILE__, "The damping parameter is outside of the range (0, 1].");
          return KIN_DAMPING_FN_ERR;
        }
      }

      /* damped fixed point */
      N_VLinearSum((ONE - kin_mem->kin_beta_aa), xold, kin_mem->kin_beta_aa,
                   gval, x);
    }
    else
    {
      /* standard fixed point */
      N_VScale(ONE, gval, x);
    }

    return KIN_SUCCESS;
  }

  /* Add a column to the QR factorization */

  if (kin_mem->kin_current_depth == 1)
  {
    R[0] = SUNRsqrt(N_VDotProd(kin_mem->kin_df_aa[0], kin_mem->kin_df_aa[0]));
    alfa = ONE / R[0];
    N_VScale(alfa, kin_mem->kin_df_aa[0], kin_mem->kin_q_aa[0]);
  }
  else
  {
    kin_mem->kin_qr_func(kin_mem->kin_q_aa, R,
                         kin_mem->kin_df_aa[kin_mem->kin_current_depth - 1],
                         (int)kin_mem->kin_current_depth - 1,
                         (int)kin_mem->kin_m_aa, (void*)kin_mem->kin_qr_data);
  }

  /* Adjust the depth */
  if (kin_mem->kin_depth_fn)
  {
    long int new_depth = kin_mem->kin_current_depth;

    retval = kin_mem->kin_depth_fn(kin_mem->kin_nni, xold, gval, fv,
                                   kin_mem->kin_df_aa, R,
                                   kin_mem->kin_current_depth,
                                   kin_mem->kin_user_data, &new_depth, NULL);
    if (retval)
    {
      KINProcessError(kin_mem, KIN_DEPTH_FN_ERR, __LINE__, __func__, __FILE__,
                      "The depth function failed.");
      return KIN_DEPTH_FN_ERR;
    }

    new_depth = SUNMIN(new_depth, kin_mem->kin_current_depth);
    new_depth = SUNMAX(new_depth, 0);

    if (new_depth == 0)
    {
      kin_mem->kin_current_depth = new_depth;

      /* do fixed point update */
      if (kin_mem->kin_damping_aa || kin_mem->kin_damping_fn)
      {
        if (kin_mem->kin_damping_fn)
        {
          retval = kin_mem->kin_damping_fn(kin_mem->kin_nni, xold, gval, NULL,
                                           0, kin_mem->kin_user_data,
                                           &(kin_mem->kin_beta_aa));
          if (retval)
          {
            KINProcessError(kin_mem, KIN_DAMPING_FN_ERR, __LINE__, __func__,
                            __FILE__, "The damping function failed.");
            return KIN_DAMPING_FN_ERR;
          }
          if (kin_mem->kin_beta_aa <= ZERO || kin_mem->kin_beta_aa > ONE)
          {
            KINProcessError(kin_mem, KIN_DAMPING_FN_ERR, __LINE__, __func__,
                            __FILE__, "The damping parameter is outside of the range (0, 1].");
            return KIN_DAMPING_FN_ERR;
          }
        }

        /* damped fixed point */
        N_VLinearSum((ONE - kin_mem->kin_beta_aa), xold, kin_mem->kin_beta_aa,
                     gval, x);
      }
      else
      {
        /* standard fixed point */
        N_VScale(ONE, gval, x);
      }

      return KIN_SUCCESS;
    }

    /* TODO(DJG): In the future, update QRDelete to support removing arbitrary
       columns from the factorization */
    if (new_depth < kin_mem->kin_current_depth)
    {
      /* Remove columns from the left one at a time */
      N_Vector tmp_dg = NULL;
      N_Vector tmp_df = NULL;

      for (int j = 0; j < kin_mem->kin_current_depth - new_depth; j++)
      {
        tmp_dg = kin_mem->kin_dg_aa[0];
        tmp_df = kin_mem->kin_df_aa[0];
        for (long int i = 1; i < kin_mem->kin_current_depth; i++)
        {
          kin_mem->kin_dg_aa[i - 1] = kin_mem->kin_dg_aa[i];
          kin_mem->kin_df_aa[i - 1] = kin_mem->kin_df_aa[i];
        }
        kin_mem->kin_dg_aa[kin_mem->kin_current_depth - 1] = tmp_dg;
        kin_mem->kin_df_aa[kin_mem->kin_current_depth - 1] = tmp_df;

        retval = AndersonAccQRDelete(kin_mem, kin_mem->kin_q_aa, R,
                                     (int)kin_mem->kin_current_depth);
        if (retval) { return retval; }

        kin_mem->kin_current_depth--;
      }
    }
  }

  /* Solve least squares problem and update solution */
  lAA = kin_mem->kin_current_depth;

  /* Compute Q^T fv */
  retval = N_VDotProdMulti((int)lAA, fv, kin_mem->kin_q_aa, gamma);
  if (retval != KIN_SUCCESS) { return (KIN_VECTOROP_ERR); }

  /* Compute the damping factor before overwriting gamma below so we can pass
     gamma = Q^T fv (just computed above) to the damping function as it can be
     used to compute the acceleration gain = sqrt(1 - ||Q^T fv||^2/||fv||^2). */
  if (kin_mem->kin_damping_fn)
  {
    retval = kin_mem->kin_damping_fn(kin_mem->kin_nni, xold, gval, gamma, lAA,
                                     kin_mem->kin_user_data,
                                     &(kin_mem->kin_beta_aa));
    if (retval)
    {
      KINProcessError(kin_mem, KIN_DAMPING_FN_ERR, __LINE__, __func__, __FILE__,
                      "The damping function failed.");
      return KIN_DAMPING_FN_ERR;
    }
    if (kin_mem->kin_beta_aa <= ZERO || kin_mem->kin_beta_aa > ONE)
    {
      KINProcessError(kin_mem, KIN_DAMPING_FN_ERR, __LINE__, __func__, __FILE__,
                      "The damping parameter is outside of the range (0, 1].");
      return KIN_DAMPING_FN_ERR;
    }
  }

  /* set arrays for fused vector operation */
  cv[0] = ONE;
  Xv[0] = gval;
  nvec  = 1;

  /* Solve the upper triangular system R gamma = Q^T fv */
  for (long int i = lAA - 1; i > -1; i--)
  {
    for (long int j = i + 1; j < lAA; j++)
    {
      gamma[i] = gamma[i] - R[j * kin_mem->kin_m_aa + i] * gamma[j];
    }
    gamma[i] = gamma[i] / R[i * kin_mem->kin_m_aa + i];

    cv[nvec] = -gamma[i];
    Xv[nvec] = kin_mem->kin_dg_aa[i];
    nvec += 1;
  }

  /* if enabled, apply damping */
  if (kin_mem->kin_damping_aa || kin_mem->kin_damping_fn)
  {
    onembeta = (ONE - kin_mem->kin_beta_aa);
    cv[nvec] = -onembeta;
    Xv[nvec] = fv;
    nvec += 1;
    for (long int i = lAA - 1; i > -1; i--)
    {
      cv[nvec] = onembeta * gamma[i];
      Xv[nvec] = kin_mem->kin_df_aa[i];
      nvec += 1;
    }
  }

  /* update solution */
  retval = N_VLinearCombination(nvec, cv, Xv, x);
  if (retval != KIN_SUCCESS) { return (KIN_VECTOROP_ERR); }

  return KIN_SUCCESS;
}